

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O1

void __thiscall
StringEqualFailure::StringEqualFailure
          (StringEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,char *expected
          ,char *actual,SimpleString *text)

{
  SimpleString *this_00;
  long lVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  SimpleString *actual_00;
  long lVar7;
  SimpleString *pos;
  SimpleString printableActual;
  undefined1 local_60 [32];
  SimpleString local_40;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_0012dba8;
  TestFailure::createUserText((TestFailure *)local_60,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)local_60);
  PrintableStringFromOrNull(local_60);
  PrintableStringFromOrNull((char *)&local_40);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_60);
  pcVar6 = SimpleString::asCharString(&local_40);
  StringFromFormat(local_60 + 0x10,"expected <%s>\n\tbut was  <%s>",pcVar5,pcVar6);
  SimpleString::operator+=(this_00,(SimpleString *)(local_60 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_60 + 0x10));
  if (actual != (char *)0x0 && expected != (char *)0x0) {
    lVar7 = -1;
    do {
      lVar1 = lVar7 + 1;
      lVar2 = lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (actual[lVar1] == expected[lVar2]);
    pos = (SimpleString *)0x0;
    while( true ) {
      cVar3 = SimpleString::at(&local_40,(size_t)pos);
      actual_00 = pos;
      cVar4 = SimpleString::at((SimpleString *)local_60,(size_t)pos);
      if (cVar3 != cVar4) break;
      pos = (SimpleString *)((long)&pos->buffer_ + 1);
    }
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)(local_60 + 0x10),actual_00,(size_t)&local_40,(size_t)pos);
    SimpleString::operator+=(this_00,(SimpleString *)(local_60 + 0x10));
    SimpleString::~SimpleString((SimpleString *)(local_60 + 0x10));
  }
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString((SimpleString *)local_60);
  return;
}

Assistant:

StringEqualFailure::StringEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString printableExpected = PrintableStringFromOrNull(expected);
    SimpleString printableActual = PrintableStringFromOrNull(actual);

    message_ += createButWasString(printableExpected, printableActual);
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
            ;
        size_t failStartPrintable;
        for (failStartPrintable = 0; printableActual.at(failStartPrintable) == printableExpected.at(failStartPrintable); failStartPrintable++)
            ;
        message_ += createDifferenceAtPosString(printableActual, failStartPrintable, failStart);
    }
}